

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::SpectrumCheckerboardTexture::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SpectrumCheckerboardTexture *this)

{
  ulong uVar1;
  ulong uVar2;
  char **in_stack_ffffffffffffff70;
  char *local_88;
  SpectrumTextureHandle local_80;
  string local_78;
  char *local_58;
  string local_50;
  
  uVar1 = (this->map2D).
          super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
          .bits;
  local_88 = "(nullptr)";
  if ((uVar1 & 0xffffffffffff) != 0) {
    TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
    ::ToString_abi_cxx11_
              (&local_50,
               (TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                *)this);
    local_88 = local_50._M_dataplus._M_p;
  }
  uVar2 = (this->map3D).super_TaggedPointer<pbrt::TransformMapping3D>.bits;
  local_58 = "(nullptr)";
  if ((uVar2 & 0xffffffffffff) != 0) {
    TaggedPointer<pbrt::TransformMapping3D>::ToString_abi_cxx11_
              (&local_78,&(this->map3D).super_TaggedPointer<pbrt::TransformMapping3D>);
    local_58 = local_78._M_dataplus._M_p;
  }
  local_80.
  super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
           )0x284cdc2;
  if (this->aaMethod == None) {
    local_80.
    super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
    .bits = (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             )0x28488ae;
  }
  StringPrintf<char_const*,char_const*,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,char_const*>
            (__return_storage_ptr__,
             (pbrt *)
             "[ SpectrumCheckerboardTexture map2D: %s map3D: %s tex[0]: %s tex[1]: %s aaMethod: %s]"
             ,(char *)&local_88,&local_58,(char **)this->tex,this->tex + 1,&local_80,
             in_stack_ffffffffffffff70);
  if ((uVar2 & 0xffffffffffff) != 0) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((uVar1 & 0xffffffffffff) != 0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SpectrumCheckerboardTexture::ToString() const {
    return StringPrintf("[ SpectrumCheckerboardTexture map2D: %s map3D: %s "
                        "tex[0]: %s tex[1]: %s aaMethod: %s]",
                        map2D ? map2D.ToString().c_str() : "(nullptr)",
                        map3D ? map3D.ToString().c_str() : "(nullptr)", tex[0], tex[1],
                        aaMethod == AAMethod::None ? "none" : "closed-form");
}